

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::peer_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,peer_error_alert *this)

{
  error_category *peVar1;
  _Alloc_hider _Var2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *pcVar6;
  char buf [200];
  string local_158;
  string local_138;
  string local_118;
  char local_f8 [208];
  
  peer_alert::message_abi_cxx11_(&local_138,&this->super_peer_alert);
  _Var2._M_p = local_138._M_dataplus._M_p;
  uVar4 = (ulong)(byte)(this->super_peer_alert).field_0x9c;
  if (uVar4 < 0x2b) {
    pcVar6 = operation_name::names[uVar4];
  }
  else {
    pcVar6 = "unknown operation";
  }
  iVar3 = (**((this->error).cat_)->_vptr_error_category)();
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_158,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_118,&local_158);
  snprintf(local_f8,200,"%s peer error [%s] [%s]: %s",_Var2._M_p,pcVar6,CONCAT44(extraout_var,iVar3)
           ,local_118._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen(local_f8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_f8,local_f8 + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_error_alert::message() const
	{
		char buf[200];
		std::snprintf(buf, sizeof(buf), "%s peer error [%s] [%s]: %s"
			, peer_alert::message().c_str()
			, operation_name(op), error.category().name()
			, convert_from_native(error.message()).c_str());
		return buf;
	}